

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::Printf<float&,char>(char *fmt,float *args,char *args_1)

{
  char *in_R8;
  string s;
  string local_28;
  
  StringPrintf<float&,char>(&local_28,(pbrt *)fmt,(char *)args,(float *)args_1,in_R8);
  fputs(local_28._M_dataplus._M_p,_stdout);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}